

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O0

int Wildcard::wildcardfit(char *wildcard,char *test)

{
  char cVar1;
  uint uVar2;
  char *in_RSI;
  char *in_RDI;
  int fit;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffe3;
  uint in_stack_ffffffffffffffe8;
  uint uVar4;
  char *local_10;
  char *local_8;
  
  uVar4 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar2 = in_stack_ffffffffffffffe8 & 0xffffff;
    if ((*local_8 != '\0') && (uVar2 = in_stack_ffffffffffffffe8 & 0xffffff, uVar4 == 1)) {
      uVar2 = CONCAT13(*local_10 != '\0',(int3)in_stack_ffffffffffffffe8);
    }
    in_stack_ffffffffffffffe8 = uVar2;
    if ((char)(in_stack_ffffffffffffffe8 >> 0x18) == '\0') break;
    cVar1 = *local_8;
    if (cVar1 == '*') {
      uVar4 = asterisk((char **)CONCAT44(uVar4,in_stack_ffffffffffffffe8),
                       (char **)CONCAT44(0x2a,CONCAT13(in_stack_ffffffffffffffe3,
                                                       CONCAT12(in_stack_ffffffffffffffe2,
                                                                in_stack_ffffffffffffffe0))));
      local_8 = local_8 + -1;
    }
    else if (cVar1 == '?') {
      local_10 = local_10 + 1;
    }
    else if (cVar1 == '[') {
      local_8 = local_8 + 1;
      uVar4 = set(&local_8,&local_10);
    }
    else {
      uVar4 = (uint)(*local_8 == *local_10);
      local_10 = local_10 + 1;
    }
    local_8 = local_8 + 1;
  }
  for (; *local_8 == '*' && uVar4 == 1; local_8 = local_8 + 1) {
  }
  bVar3 = false;
  if ((uVar4 == 1) && (bVar3 = false, *local_10 == '\0')) {
    bVar3 = *local_8 == '\0';
  }
  return (int)bVar3;
}

Assistant:

int Wildcard::wildcardfit(const char* wildcard, const char* test) {
  int fit = 1;

  for (; ('\000' != *wildcard) && (1 == fit) && ('\000' != *test); wildcard++) {
    switch (*wildcard) {
    case '[':
      wildcard++; /* leave out the opening square bracket */
      fit = set(&wildcard, &test);
      /* we don't need to decrement the wildcard as in case */
      /* of asterisk because the closing ] is still there */
      break;
    case '?':
      test++;
      break;
    case '*':
      fit = asterisk(&wildcard, &test);
      /* the asterisk was skipped by asterisk() but the loop will */
      /* increment by itself. So we have to decrement */
      wildcard--;
      break;
    default:
      fit = (int)(*wildcard == *test);
      test++;
    }
  }
  while ((*wildcard == '*') && (1 == fit))
    /* here the teststring is empty otherwise you cannot */
    /* leave the previous loop */
    wildcard++;
  return (int)((1 == fit) && ('\0' == *test) && ('\0' == *wildcard));
}